

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O2

void Curl_llist_insert_next(Curl_llist *list,Curl_llist_node *e,void *p,Curl_llist_node *ne)

{
  size_t sVar1;
  Curl_llist *pCVar2;
  Curl_llist *pCVar3;
  Curl_llist_node **ppCVar4;
  
  ne->_ptr = p;
  ne->_list = list;
  sVar1 = list->_size;
  if (sVar1 == 0) {
    list->_head = ne;
    pCVar2 = (Curl_llist *)&list->_tail;
    ne->_prev = (Curl_llist_node *)0x0;
    ne->_next = (Curl_llist_node *)0x0;
  }
  else {
    pCVar2 = (Curl_llist *)&e->_next;
    pCVar3 = pCVar2;
    if (e == (Curl_llist_node *)0x0) {
      pCVar3 = list;
    }
    ne->_next = pCVar3->_head;
    ne->_prev = e;
    if (e == (Curl_llist_node *)0x0) {
      list->_head->_prev = ne;
      pCVar2 = list;
    }
    else {
      ppCVar4 = &(*(Curl_llist_node **)pCVar2)->_prev;
      if (*(Curl_llist_node **)pCVar2 == (Curl_llist_node *)0x0) {
        ppCVar4 = &list->_tail;
      }
      *ppCVar4 = ne;
    }
  }
  pCVar2->_head = ne;
  list->_size = sVar1 + 1;
  return;
}

Assistant:

void
Curl_llist_insert_next(struct Curl_llist *list,
                       struct Curl_llist_node *e, /* may be NULL */
                       const void *p,
                       struct Curl_llist_node *ne)
{
  DEBUGASSERT(list);
  DEBUGASSERT(list->_init == LLISTINIT);
  DEBUGASSERT(ne);

#ifdef DEBUGBUILD
  ne->_init = NODEINIT;
#endif
  ne->_ptr = (void *) p;
  ne->_list = list;
  if(list->_size == 0) {
    list->_head = ne;
    list->_head->_prev = NULL;
    list->_head->_next = NULL;
    list->_tail = ne;
  }
  else {
    /* if 'e' is NULL here, we insert the new element first in the list */
    ne->_next = e?e->_next:list->_head;
    ne->_prev = e;
    if(!e) {
      list->_head->_prev = ne;
      list->_head = ne;
    }
    else if(e->_next) {
      e->_next->_prev = ne;
    }
    else {
      list->_tail = ne;
    }
    if(e)
      e->_next = ne;
  }

  ++list->_size;
}